

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  cmake *cmakeInstance;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *p_Var7;
  size_t sVar8;
  ostream *poVar9;
  cmGeneratorTarget *this_00;
  string *psVar10;
  WrapQuotes wrapQuotes;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  pointer ppVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar12;
  string_view str;
  string_view str_00;
  string_view str_01;
  anon_class_40_5_cf5cfc57 addLauncher;
  string local_118;
  string *local_f8;
  undefined1 local_f0 [8];
  cmList argv;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  string exe;
  string equalSigns;
  cmGeneratorExpression ge;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_60;
  string local_50 [32];
  
  this->TestGenerated = true;
  local_f8 = config;
  cmakeInstance = cmMakefile::GetCMakeInstance(this->Test->Makefile);
  p_Var7 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            *)cmTest::GetBacktrace(this->Test);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_60,p_Var7);
  cmGeneratorExpression::cmGeneratorExpression(&ge,cmakeInstance,(cmListFileBacktrace *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  pcVar1 = this->Test->Makefile;
  std::__cxx11::string::string((string *)&addLauncher,(string *)&this->Test->Name);
  bVar4 = anon_unknown.dwarf_b74298::needToQuoteTestName(pcVar1,(string *)&addLauncher);
  std::__cxx11::string::~string((string *)&addLauncher);
  std::__cxx11::string::string((string *)&addLauncher,(string *)&this->Test->Name);
  sVar8 = anon_unknown.dwarf_b74298::countMaxConsecutiveEqualSigns((string *)&addLauncher);
  equalSigns._M_dataplus._M_p = (pointer)&equalSigns.field_2;
  std::__cxx11::string::_M_construct((ulong)&equalSigns,(char)sVar8 + '\x01');
  std::__cxx11::string::~string((string *)&addLauncher);
  if (bVar4) {
    poVar9 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar9 = std::operator<<(poVar9,"add_test([");
    poVar9 = std::operator<<(poVar9,(string *)&equalSigns);
    poVar9 = std::operator<<(poVar9,"[");
    std::__cxx11::string::string((string *)&addLauncher,(string *)&this->Test->Name);
    poVar9 = std::operator<<(poVar9,(string *)&addLauncher);
    poVar9 = std::operator<<(poVar9,"]");
    poVar9 = std::operator<<(poVar9,(string *)&equalSigns);
    std::operator<<(poVar9,"] ");
  }
  else {
    poVar9 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar9 = std::operator<<(poVar9,"add_test(");
    std::__cxx11::string::string((string *)&addLauncher,(string *)&this->Test->Name);
    poVar9 = std::operator<<(poVar9,(string *)&addLauncher);
    std::operator<<(poVar9," ");
  }
  std::__cxx11::string::~string((string *)&addLauncher);
  psVar10 = local_f8;
  EvaluateCommandLineArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&addLauncher,this,&this->Test->Command,&ge,local_f8);
  bVar5 = cmTest::GetCommandExpandLists(this->Test);
  cmList::cmList(&argv,(container_type *)&addLauncher,(uint)bVar5,Yes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&addLauncher);
  if (argv.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      argv.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&argv.Values);
  }
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             argv.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,&exe);
  if (this_00 != (cmGeneratorTarget *)0x0) {
    TVar6 = cmGeneratorTarget::GetType(this_00);
    psVar3 = local_f8;
    if (TVar6 == EXECUTABLE) {
      psVar10 = (string *)0x0;
      cmGeneratorTarget::GetFullPath
                ((string *)&addLauncher,this_00,local_f8,RuntimeBinaryArtifact,false);
      std::__cxx11::string::operator=((string *)&exe,(string *)&addLauncher);
      std::__cxx11::string::~string((string *)&addLauncher);
      addLauncher.config = psVar3;
      addLauncher.this = this;
      addLauncher.ge = &ge;
      addLauncher.os = os;
      addLauncher.target = this_00;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"TEST_LAUNCHER",(allocator<char> *)&local_d0);
      GenerateScriptForConfig::anon_class_40_5_cf5cfc57::operator()(&addLauncher,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      if (this->Test->PolicyStatusCMP0158 == NEW) {
        pcVar1 = this->LG->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"CMAKE_CROSSCOMPILING",(allocator<char> *)&local_d0);
        bVar5 = cmMakefile::IsOn(pcVar1,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        if (!bVar5) goto LAB_002ef2d8;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"CROSSCOMPILING_EMULATOR",(allocator<char> *)&local_d0);
      GenerateScriptForConfig::anon_class_40_5_cf5cfc57::operator()(&addLauncher,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      goto LAB_002ef2d8;
    }
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&exe);
LAB_002ef2d8:
  str._M_str = (char *)0x0;
  str._M_len = (size_t)exe._M_dataplus._M_p;
  cmOutputConverter::EscapeForCMake_abi_cxx11_
            ((string *)&addLauncher,(cmOutputConverter *)exe._M_string_length,str,
             (WrapQuotes)psVar10);
  std::operator<<(os,(string *)&addLauncher);
  std::__cxx11::string::~string((string *)&addLauncher);
  pbVar2 = argv.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar12 = pbVar2 + 1,
        pbVar12 !=
        argv.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    poVar9 = std::operator<<(os," ");
    str_00._M_str = (char *)0x0;
    str_00._M_len = (size_t)(pbVar12->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              ((string *)&addLauncher,(cmOutputConverter *)pbVar2[1]._M_string_length,str_00,
               (WrapQuotes)psVar10);
    std::operator<<(poVar9,(string *)&addLauncher);
    std::__cxx11::string::~string((string *)&addLauncher);
    pbVar2 = pbVar12;
  }
  std::operator<<(os,")\n");
  if (bVar4) {
    poVar9 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar9 = std::operator<<(poVar9,"set_tests_properties([");
    poVar9 = std::operator<<(poVar9,(string *)&equalSigns);
    poVar9 = std::operator<<(poVar9,"[");
    std::__cxx11::string::string((string *)&addLauncher,(string *)&this->Test->Name);
    poVar9 = std::operator<<(poVar9,(string *)&addLauncher);
    poVar9 = std::operator<<(poVar9,"]");
    poVar9 = std::operator<<(poVar9,(string *)&equalSigns);
    std::operator<<(poVar9,"] PROPERTIES ");
  }
  else {
    poVar9 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar9 = std::operator<<(poVar9,"set_tests_properties(");
    std::__cxx11::string::string((string *)&addLauncher,(string *)&this->Test->Name);
    poVar9 = std::operator<<(poVar9,(string *)&addLauncher);
    std::operator<<(poVar9," PROPERTIES ");
  }
  std::__cxx11::string::~string((string *)&addLauncher);
  cmPropertyMap::GetList_abi_cxx11_(&local_d0,&this->Test->Properties);
  for (ppVar11 = local_d0.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVar11 !=
      local_d0.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVar11 = ppVar11 + 1) {
    poVar9 = std::operator<<(os," ");
    poVar9 = std::operator<<(poVar9,(string *)ppVar11);
    poVar9 = std::operator<<(poVar9," ");
    std::__cxx11::string::string(local_50,(string *)&ppVar11->second);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_f0,(string *)&ge);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    wrapQuotes = Wrap;
    psVar10 = cmCompiledGeneratorExpression::Evaluate
                        ((cmCompiledGeneratorExpression *)local_f0,this->LG,local_f8,
                         (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                         (cmGeneratorTarget *)0x0,&local_118);
    str_01._M_str = (char *)0x0;
    str_01._M_len = (size_t)(psVar10->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              ((string *)&addLauncher,(cmOutputConverter *)psVar10->_M_string_length,str_01,
               wrapQuotes);
    std::operator<<(poVar9,(string *)&addLauncher);
    std::__cxx11::string::~string((string *)&addLauncher);
    std::__cxx11::string::~string((string *)&local_118);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_f0);
    std::__cxx11::string::~string(local_50);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_d0);
  GenerateInternalProperties(this,os);
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)&exe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argv.Values);
  std::__cxx11::string::~string((string *)&equalSigns);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(*this->Test->GetMakefile()->GetCMakeInstance(),
                           this->Test->GetBacktrace());

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Start the test command.
  if (quote_test_name) {
    os << indent << "add_test([" << equalSigns << "[" << this->Test->GetName()
       << "]" << equalSigns << "] ";
  } else {
    os << indent << "add_test(" << this->Test->GetName() << " ";
  }

  // Evaluate command line arguments
  cmList argv{
    this->EvaluateCommandLineArguments(this->Test->GetCommand(), ge, config),
    // Expand arguments if COMMAND_EXPAND_LISTS is set
    this->Test->GetCommandExpandLists() ? cmList::ExpandElements::Yes
                                        : cmList::ExpandElements::No,
    cmList::EmptyElements::Yes
  };
  // Expanding lists on an empty command may have left it empty
  if (argv.empty()) {
    argv.emplace_back();
  }

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = argv[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    auto addLauncher = [this, &config, &ge, &os,
                        target](std::string const& propertyName) {
      cmValue launcher = target->GetProperty(propertyName);
      if (!cmNonempty(launcher)) {
        return;
      }
      cmList launcherWithArgs{ ge.Parse(*launcher)->Evaluate(this->LG,
                                                             config) };
      if (!launcherWithArgs.empty() && !launcherWithArgs[0].empty()) {
        std::string launcherExe(launcherWithArgs[0]);
        cmSystemTools::ConvertToUnixSlashes(launcherExe);
        os << cmOutputConverter::EscapeForCMake(launcherExe) << " ";
        for (std::string const& arg :
             cmMakeRange(launcherWithArgs).advance(1)) {
          os << cmOutputConverter::EscapeForCMake(arg) << " ";
        }
      }
    };

    // Prepend with the test launcher if specified.
    addLauncher("TEST_LAUNCHER");

    // Prepend with the emulator when cross compiling if required.
    if (!this->GetTest()->GetCMP0158IsNew() ||
        this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
      addLauncher("CROSSCOMPILING_EMULATOR");
    }
  } else {
    // Use the command name given.
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);

  for (auto const& arg : cmMakeRange(argv).advance(1)) {
    os << " " << cmOutputConverter::EscapeForCMake(arg);
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    os << indent << "set_tests_properties([" << equalSigns << "["
       << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    os << " " << i.first << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(i.second)->Evaluate(this->LG, config));
  }
  this->GenerateInternalProperties(os);
  os << ")\n";
}